

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlTablePass.cpp
# Opt level: O1

void __thiscall GdlPass::ClearFsmWorkSpace(GdlPass *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  void *pvVar3;
  FsmMachineClass *pFVar4;
  pointer pcVar5;
  pointer puVar6;
  _Rb_tree_node_base *p_Var7;
  pointer ppFVar8;
  pointer ppFVar9;
  ulong uVar10;
  
  for (p_Var7 = (this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    p_Var2 = p_Var7[1]._M_parent;
    if (p_Var2 != (_Base_ptr)0x0) {
      pvVar3 = *(void **)p_Var2;
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)p_Var2->_M_left - (long)pvVar3);
      }
      operator_delete(p_Var2,0x18);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>,_std::_Select1st<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
  ::clear(&(this->m_hmMachineClassMap)._M_t);
  ppFVar8 = (this->m_vpfsmc).
            super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppFVar9 = (this->m_vpfsmc).
            super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar9 != ppFVar8) {
    uVar10 = 0;
    do {
      pFVar4 = ppFVar8[uVar10];
      if (pFVar4 != (FsmMachineClass *)0x0) {
        pcVar5 = (pFVar4->staDebug)._M_dataplus._M_p;
        paVar1 = &(pFVar4->staDebug).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != paVar1) {
          operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
        }
        puVar6 = (pFVar4->m_wGlyphs).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar6 != (pointer)0x0) {
          operator_delete(puVar6,(long)(pFVar4->m_wGlyphs).
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar6);
        }
        std::
        _Rb_tree<GdlGlyphClassDefn_*,_GdlGlyphClassDefn_*,_std::_Identity<GdlGlyphClassDefn_*>,_std::less<GdlGlyphClassDefn_*>,_std::allocator<GdlGlyphClassDefn_*>_>
        ::~_Rb_tree(&(pFVar4->m_scs)._M_t);
        operator_delete(pFVar4,0x78);
      }
      uVar10 = uVar10 + 1;
      ppFVar8 = (this->m_vpfsmc).
                super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppFVar9 = (this->m_vpfsmc).
                super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (uVar10 < (ulong)((long)ppFVar9 - (long)ppFVar8 >> 3));
  }
  if (ppFVar9 != ppFVar8) {
    (this->m_vpfsmc).super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppFVar8;
  }
  return;
}

Assistant:

void GdlPass::ClearFsmWorkSpace()
{
	//	Delete all the machine-class lists in the hash map.
	for (std::map<int, MachineClassList>::iterator hmit = m_hmMachineClassMap.begin();
		hmit != m_hmMachineClassMap.end();
		++hmit)
	{
		delete hmit->second;	// vector containing a group of machine classes with the same key;
								// notice that we store a pointer to the vector which is separately
								// allocated, not the vector itself, due to the limitations of the
								// previous HashMap implementation.
	}
	m_hmMachineClassMap.clear();

	//	Delete all the FsmMachineClasses and clear the master list.
	for (size_t i = 0; i < m_vpfsmc.size(); i++)
		delete m_vpfsmc[i];
	m_vpfsmc.clear();
}